

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

Ref __thiscall
cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref,cashew::Ref>
          (ValueBuilder *this,IString target,Ref args,Ref args_1,Ref args_2)

{
  Value *pVVar1;
  Ref RVar2;
  char *extraout_RDX;
  IString name;
  Ref local_80;
  Value *local_78;
  Value *local_70;
  size_t i;
  Ref argArray [3];
  Ref local_48;
  Ref callArgs;
  size_t nArgs;
  Ref args_local_2;
  Ref args_local_1;
  Ref args_local;
  IString target_local;
  
  target_local.str._M_len = target.str._M_len;
  callArgs.inst = (Value *)0x3;
  local_48 = makeRawArray(3);
  i = (size_t)target.str._M_str;
  argArray[0].inst = args.inst;
  argArray[1].inst = args_1.inst;
  for (local_70 = (Value *)0x0; local_70 < callArgs.inst;
      local_70 = (Value *)((long)&local_70->type + 1)) {
    pVVar1 = Ref::operator->(&local_48);
    local_78 = argArray[(long)&local_70[-1].field_1.num + 0xf].inst;
    Value::push_back(pVVar1,(Ref)local_78);
  }
  local_80 = makeRawArray(3);
  pVVar1 = Ref::operator->(&local_80);
  RVar2 = makeRawString((IString *)&CALL);
  pVVar1 = Value::push_back(pVVar1,RVar2);
  name.str._M_str = extraout_RDX;
  name.str._M_len = target_local.str._M_len;
  RVar2 = makeName(this,name);
  pVVar1 = Value::push_back(pVVar1,RVar2);
  pVVar1 = Value::push_back(pVVar1,local_48);
  Ref::Ref((Ref *)&target_local.str._M_str,pVVar1);
  return (Ref)(Value *)target_local.str._M_str;
}

Assistant:

static Ref makeCall(IString target, Ts... args) {
    size_t nArgs = sizeof...(Ts);
    Ref callArgs = makeRawArray(nArgs);
    Ref argArray[] = {args...};
    for (size_t i = 0; i < nArgs; ++i) {
      callArgs->push_back(argArray[i]);
    }
    return &makeRawArray(3)
              ->push_back(makeRawString(CALL))
              .push_back(makeName(target))
              .push_back(callArgs);
  }